

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMate.cpp
# Opt level: O2

void __thiscall
chrono::ChLinkMateFix::Initialize
          (ChLinkMateFix *this,shared_ptr<chrono::ChBodyFrame> *mbody1,
          shared_ptr<chrono::ChBodyFrame> *mbody2)

{
  __shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2> _Stack_148;
  __shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2> local_138;
  ChFrame<double> local_128;
  ChFrame<double> local_a0;
  
  std::__shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_138,&mbody1->super___shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>
            );
  std::__shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&_Stack_148,
             &mbody2->super___shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>);
  ChFrame<double>::ChFrame
            (&local_a0,
             (ChFrame<double> *)
             (mbody1->super___shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  ChFrame<double>::ChFrame
            (&local_128,
             (ChFrame<double> *)
             (mbody1->super___shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  ChLinkMateGeneric::Initialize
            (&this->super_ChLinkMateGeneric,(shared_ptr<chrono::ChBodyFrame> *)&local_138,
             (shared_ptr<chrono::ChBodyFrame> *)&_Stack_148,false,&local_a0,&local_128);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_148._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_138._M_refcount);
  return;
}

Assistant:

void ChLinkMateFix::Initialize(std::shared_ptr<ChBodyFrame> mbody1,
                                     std::shared_ptr<ChBodyFrame> mbody2)
{
    ChLinkMateGeneric::Initialize(
        mbody1, mbody2, 
        false,               // constraint reference frame in abs coords
        ChFrame<>(*mbody1),  // defaults to have constraint reference frame as mbody1 coordsystem
        ChFrame<>(*mbody1)   // defaults to have constraint reference frame as mbody1 coordsystem
        ); 
}